

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * cfd::core::ScriptUtil::CreateMultisigRedeemScript
                   (Script *__return_storage_ptr__,uint32_t require_signature_num,
                   vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys,
                   bool has_witness)

{
  pointer pPVar1;
  bool bVar2;
  CfdException *pCVar3;
  Pubkey *pubkey;
  pointer pPVar4;
  allocator local_12d;
  uint32_t require_signature_num_local;
  ScriptBuilder builder;
  ScriptElement op_require_num;
  undefined1 local_a8 [32];
  ScriptElement op_pubkey_num;
  
  require_signature_num_local = require_signature_num;
  if (require_signature_num == 0) {
    op_require_num._vptr_ScriptElement = (_func_int **)0x4ee5cd;
    op_require_num.type_ = 0x5d1;
    op_require_num.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_323407;
    logger::warn<>((CfdSourceLocation *)&op_require_num,
                   "Invalid require_sig_num. require_sig_num = 0");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&op_require_num,"CreateMultisigScript require_num is 0.",
               (allocator *)&op_pubkey_num);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&op_require_num);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pPVar4 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pPVar4 == pPVar1) {
    op_require_num._vptr_ScriptElement = (_func_int **)0x4ee5cd;
    op_require_num.type_ = 0x5d7;
    op_require_num.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_323407;
    logger::warn<>((CfdSourceLocation *)&op_require_num,"pubkey array is empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&op_require_num,"CreateMultisigScript empty pubkey array.",
               (allocator *)&op_pubkey_num);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&op_require_num);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  op_pubkey_num._vptr_ScriptElement = (_func_int **)(((long)pPVar1 - (long)pPVar4) / 0x18);
  if (op_pubkey_num._vptr_ScriptElement < (_func_int **)(ulong)require_signature_num) {
    op_require_num._vptr_ScriptElement = (_func_int **)0x4ee5cd;
    op_require_num.type_ = 0x5de;
    op_require_num.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_323407;
    logger::warn<unsigned_int&,unsigned_long>
              ((CfdSourceLocation *)&op_require_num,
               "Invalid require_sig_num. require_sig_num={0}, pubkey size={1}.",
               &require_signature_num_local,(unsigned_long *)&op_pubkey_num);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&op_require_num,"CreateMultisigScript require_num is over.",
               (allocator *)&op_pubkey_num);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&op_require_num);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (op_pubkey_num._vptr_ScriptElement <= (_func_int **)((ulong)has_witness * 5 + 0xf)) {
    ScriptElement::ScriptElement(&op_require_num,(int64_t)(ulong)require_signature_num);
    ScriptElement::ScriptElement
              (&op_pubkey_num,
               ((long)(pubkeys->
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pubkeys->
                     super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
    builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ScriptBuilder::AppendElement(&builder,&op_require_num);
    pPVar1 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar4 = (pubkeys->
                  super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl
                  .super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
      ScriptBuilder::AppendData(&builder,pPVar4);
    }
    ScriptBuilder::AppendElement(&builder,&op_pubkey_num);
    ScriptBuilder::AppendOperator(&builder,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG);
    ScriptBuilder::Build(__return_storage_ptr__,&builder);
    if (!has_witness) {
      bVar2 = IsValidRedeemScript(__return_storage_ptr__);
      if (!bVar2) {
        local_a8._0_8_ = "cfdcore_script.cpp";
        local_a8._8_4_ = 0x5f8;
        local_a8._16_8_ = "CreateMultisigRedeemScript";
        logger::warn<>((CfdSourceLocation *)local_a8,"Multisig script size is over.");
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_a8,"CreateMultisigScript multisig script size is over.",
                   &local_12d);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    ScriptBuilder::~ScriptBuilder(&builder);
    ScriptElement::~ScriptElement(&op_pubkey_num);
    ScriptElement::~ScriptElement(&op_require_num);
    return __return_storage_ptr__;
  }
  op_require_num._vptr_ScriptElement = (_func_int **)0x4ee5cd;
  op_require_num.type_ = 0x5e7;
  op_require_num.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_323407;
  logger::warn<>((CfdSourceLocation *)&op_require_num,"pubkey array size is over.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&op_require_num,"CreateMultisigScript pubkeys array size is over.",
             (allocator *)&op_pubkey_num);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&op_require_num);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Script ScriptUtil::CreateMultisigRedeemScript(
    uint32_t require_signature_num, const std::vector<Pubkey>& pubkeys,
    bool has_witness) {
  if (require_signature_num == 0) {
    warn(CFD_LOG_SOURCE, "Invalid require_sig_num. require_sig_num = 0");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript require_num is 0.");
  }
  if (pubkeys.empty()) {
    warn(CFD_LOG_SOURCE, "pubkey array is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript empty pubkey array.");
  }
  if (require_signature_num > pubkeys.size()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid require_sig_num. require_sig_num={0}, pubkey size={1}.",
        require_signature_num, pubkeys.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript require_num is over.");
  }
  size_t max_num = (has_witness) ? Script::kMaxMultisigPubkeyNum : 15;
  if (pubkeys.size() > max_num) {
    warn(CFD_LOG_SOURCE, "pubkey array size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript pubkeys array size is over.");
  }

  ScriptElement op_require_num(static_cast<int64_t>(require_signature_num));
  ScriptElement op_pubkey_num(static_cast<int64_t>(pubkeys.size()));

  // create script
  ScriptBuilder builder;
  builder << op_require_num;
  for (const Pubkey& pubkey : pubkeys) builder << pubkey;
  builder << op_pubkey_num << ScriptOperator::OP_CHECKMULTISIG;
  Script redeem_script = builder.Build();

  if ((!has_witness) && (!IsValidRedeemScript(redeem_script))) {
    warn(CFD_LOG_SOURCE, "Multisig script size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript multisig script size is over.");
  }
  return redeem_script;
}